

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall
ON_SubDLevel::ClearComponentDamagedState
          (ON_SubDLevel *this,bool bClearVerticesDamagedState,bool bClearEdgesDamagedState,
          bool bClearFacesDamagedState)

{
  ON_SubDVertex *pOVar1;
  ON_SubDEdge *pOVar2;
  ON_SubDFace *pOVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  ON_SubDVertex **ppOVar6;
  uint uVar7;
  ON_SubDEdge **ppOVar8;
  ON_SubDFace **ppOVar9;
  
  uVar5 = 0;
  if ((int)CONCAT71(in_register_00000031,bClearVerticesDamagedState) != 0) {
    ppOVar6 = this->m_vertex;
    uVar5 = 0;
    for (uVar7 = 0;
        (pOVar1 = *ppOVar6, pOVar1 != (ON_SubDVertex *)0x0 && (uVar7 < this->m_vertex_count));
        uVar7 = uVar7 + 1) {
      uVar4 = ON_ComponentStatus::SetDamagedState
                        (&(pOVar1->super_ON_SubDComponentBase).m_status,false);
      uVar5 = (uVar5 + 1) - (uint)(uVar4 == 0);
      ppOVar6 = &pOVar1->m_next_vertex;
    }
  }
  if (bClearEdgesDamagedState) {
    ppOVar8 = this->m_edge;
    for (uVar7 = 0;
        (pOVar2 = *ppOVar8, pOVar2 != (ON_SubDEdge *)0x0 && (uVar7 < this->m_edge_count));
        uVar7 = uVar7 + 1) {
      uVar4 = ON_ComponentStatus::SetDamagedState
                        (&(pOVar2->super_ON_SubDComponentBase).m_status,false);
      uVar5 = (uVar5 + 1) - (uint)(uVar4 == 0);
      ppOVar8 = &pOVar2->m_next_edge;
    }
  }
  if (bClearFacesDamagedState) {
    ppOVar9 = this->m_face;
    for (uVar7 = 0;
        (pOVar3 = *ppOVar9, pOVar3 != (ON_SubDFace *)0x0 && (uVar7 < this->m_face_count));
        uVar7 = uVar7 + 1) {
      uVar4 = ON_ComponentStatus::SetDamagedState
                        (&(pOVar3->super_ON_SubDComponentBase).m_status,false);
      uVar5 = (uVar5 + 1) - (uint)(uVar4 == 0);
      ppOVar9 = &pOVar3->m_next_face;
    }
  }
  return uVar5;
}

Assistant:

unsigned int ON_SubDLevel::ClearComponentDamagedState(
  bool bClearVerticesDamagedState,
  bool bClearEdgesDamagedState,
  bool bClearFacesDamagedState
) const
{
  unsigned int change_count = 0;
  unsigned int i;
  if (bClearVerticesDamagedState)
  {
    i = 0;
    for (const ON_SubDVertex* v = m_vertex[0]; nullptr != v && i++ < m_vertex_count; v = v->m_next_vertex)
      if (0 != v->m_status.SetDamagedState(false))
        ++change_count;
  }
  if (bClearEdgesDamagedState)
  {
    i = 0;
    for (const ON_SubDEdge* e = m_edge[0]; nullptr != e && i++ < m_edge_count; e = e->m_next_edge)
      if (0 != e->m_status.SetDamagedState(false))
        ++change_count;
  }
  if (bClearFacesDamagedState)
  {
    i = 0;
    for (const ON_SubDFace* f = m_face[0]; nullptr != f && i++ < m_face_count; f = f->m_next_face)
      if (0 != f->m_status.SetDamagedState(false))
        ++change_count;
  }
  return change_count;
}